

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O1

size_t __thiscall
cappuccino::utlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::
erase_range<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (utlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *key_range)

{
  pointer puVar1;
  int iVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  undefined8 uVar5;
  size_t sVar6;
  unsigned_long *key;
  pointer __k;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    uVar5 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar5);
  }
  __k = (key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__k == puVar1) {
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    do {
      p_Var3 = std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)(this + 0x50),*__k % *(ulong *)(this + 0x58),__k,*__k);
      if (p_Var3 == (__node_base_ptr)0x0) {
        p_Var4 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var4 = p_Var3->_M_nxt;
      }
      if (p_Var4 != (_Hash_node_base *)0x0) {
        utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
        ::do_erase((utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                    *)this,(size_t)p_Var4[2]._M_nxt);
        sVar6 = sVar6 + 1;
      }
      __k = __k + 1;
    } while (__k != puVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar6;
}

Assistant:

auto erase_range(const range_type& key_range) -> size_t
    {
        size_t deleted_elements{0};

        std::lock_guard guard{m_lock};

        for (auto& key : key_range)
        {
            auto keyed_position = m_keyed_elements.find(key);
            if (keyed_position != m_keyed_elements.end())
            {
                ++deleted_elements;
                do_erase(keyed_position->second);
            }
        }

        return deleted_elements;
    }